

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

void LowerBinaryMemoryOperationIntoBlock
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,VmInstruction *inst,RegVmInstructionCode iCode,RegVmInstructionCode fCode,
               RegVmInstructionCode dCode,RegVmInstructionCode lCode)

{
  SmallArray<VmValue_*,_4U> *this;
  VmValueType VVar1;
  uint uVar2;
  VmInstruction *pVVar3;
  uchar rB;
  uchar rA;
  VmValue **ppVVar4;
  VmConstant *argument;
  RegVmInstructionCode code;
  SynBase *location;
  VmValue *pVVar5;
  uchar addressReg;
  ExpressionContext *local_48;
  RegVmInstructionCode local_40;
  RegVmInstructionCode local_3c;
  VmInstruction *local_38;
  
  this = &inst->arguments;
  local_40 = fCode;
  local_3c = iCode;
  local_38 = inst;
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,0);
  rB = GetArgumentRegister(ctx,lowFunction,lowBlock,*ppVVar4);
  addressReg = '\0';
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,1);
  pVVar5 = *ppVVar4;
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,2);
  local_48 = ctx;
  argument = GetLoadRegisterAndOffset(ctx,lowFunction,lowBlock,pVVar5,*ppVVar4,&addressReg);
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,3);
  pVVar3 = local_38;
  pVVar5 = *ppVVar4;
  if ((pVVar5 == (VmValue *)0x0) || (pVVar5->typeID != 1)) {
    pVVar5 = (VmValue *)0x0;
  }
  rA = RegVmLoweredFunction::AllocateRegister(lowFunction,&local_38->super_VmValue,0,true);
  ppVVar4 = SmallArray<VmValue_*,_4U>::operator[](this,0);
  VVar1 = ((*ppVVar4)->type).type;
  uVar2 = ((*ppVVar4)->type).size;
  if ((VVar1 == VM_TYPE_INT) && (uVar2 == 4)) {
    location = (pVVar3->super_VmValue).source;
    code = local_3c;
  }
  else {
    if (((VVar1 != VM_TYPE_DOUBLE) || (uVar2 != 8)) ||
       (((local_40 == rviNop || (code = local_40, *(int *)&pVVar5[1]._vptr_VmValue != 3)) &&
        ((dCode == rviNop || (code = dCode, *(int *)&pVVar5[1]._vptr_VmValue != 4)))))) {
      code = lCode;
      if ((VVar1 != VM_TYPE_POINTER) && (uVar2 != 8 || VVar1 != VM_TYPE_LONG)) {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x2c0,
                      "void LowerBinaryMemoryOperationIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, VmInstruction *, RegVmInstructionCode, RegVmInstructionCode, RegVmInstructionCode, RegVmInstructionCode)"
                     );
      }
    }
    location = (pVVar3->super_VmValue).source;
  }
  RegVmLoweredBlock::AddInstruction(lowBlock,local_48,location,code,rA,rB,addressReg,argument);
  return;
}

Assistant:

void LowerBinaryMemoryOperationIntoBlock(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, VmInstruction *inst, RegVmInstructionCode iCode, RegVmInstructionCode fCode, RegVmInstructionCode dCode, RegVmInstructionCode lCode)
{
	unsigned char lhsReg = GetArgumentRegister(ctx, lowFunction, lowBlock, inst->arguments[0]);
	unsigned char addressReg = 0;
	VmConstant *constant = GetLoadRegisterAndOffset(ctx, lowFunction, lowBlock, inst->arguments[1], inst->arguments[2], addressReg);
	VmConstant *loadType = getType<VmConstant>(inst->arguments[3]);
	unsigned char targetReg = lowFunction->AllocateRegister(inst);

	VmType type = inst->arguments[0]->type;

	if(type == VmType::Int || (type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 4))
		lowBlock->AddInstruction(ctx, inst->source, iCode, targetReg, lhsReg, addressReg, constant);
	else if(type == VmType::Double && loadType->iValue == VM_INST_LOAD_FLOAT && fCode != rviNop)
		lowBlock->AddInstruction(ctx, inst->source, fCode, targetReg, lhsReg, addressReg, constant);
	else if(type == VmType::Double && loadType->iValue == VM_INST_LOAD_DOUBLE && dCode != rviNop)
		lowBlock->AddInstruction(ctx, inst->source, dCode, targetReg, lhsReg, addressReg, constant);
	else if(type == VmType::Long || (type.type == VM_TYPE_POINTER && NULLC_PTR_SIZE == 8))
		lowBlock->AddInstruction(ctx, inst->source, lCode, targetReg, lhsReg, addressReg, constant);
	else
		assert(!"unknown type");
}